

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::receiveCap
          (RpcConnectionState *this,Reader descriptor,ArrayPtr<kj::OwnFd> fds)

{
  RpcConnectionState *params;
  Reader ops_00;
  long lVar1;
  CapTableReader *pCVar2;
  PipelineOp *pPVar3;
  RpcClient *result_1;
  ulong in_RCX;
  ClientHook *extraout_RDX;
  undefined1 uVar4;
  ImportId importId;
  RpcConnectionState *params_00;
  ulong uVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar11;
  StringPtr reason;
  StringPtr reason_00;
  undefined1 local_f8 [16];
  Own<capnp::ClientHook,_std::nullptr_t> result;
  Maybe<kj::OwnFd> fd;
  Reader promisedAnswer;
  Array<capnp::PipelineOp> ops;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,_std::nullptr_t>
  local_78;
  NullableValue<kj::OwnFd> local_68;
  NullableValue<kj::OwnFd> local_60;
  NullableValue<kj::OwnFd> local_58;
  undefined1 local_50 [48];
  
  params_00 = (RpcConnectionState *)fds.ptr;
  uVar5 = 0xff;
  if (0x17 < descriptor._reader.dataSize) {
    uVar5 = (ulong)*(byte *)((long)descriptor._reader.data + 2) ^ 0xff;
  }
  fd.ptr.isSet = false;
  if ((uVar5 < in_RCX) && (-1 < *(int *)(fds.size_ + uVar5 * 4))) {
    kj::_::NullableValue<kj::OwnFd>::emplace<kj::OwnFd>(&fd.ptr,(OwnFd *)(fds.size_ + uVar5 * 4));
  }
  if (descriptor._reader.dataSize < 0x10) {
switchD_002cca1b_caseD_0:
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)0x0;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  }
  else {
    importId = (ImportId)fds.ptr;
    switch(*descriptor._reader.data) {
    case 0:
      goto switchD_002cca1b_caseD_0;
    case 1:
      uVar4 = false;
      if (0x3f < descriptor._reader.dataSize) {
        uVar4 = (undefined1)*(undefined4 *)((long)descriptor._reader.data + 4);
      }
      kj::Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)&local_58,&fd);
      import((RpcConnectionState *)&promisedAnswer,importId,(bool)uVar4,(Maybe<kj::OwnFd> *)0x0);
      (this->super_ErrorHandler)._vptr_ErrorHandler =
           (_func_int **)
           CONCAT44(promisedAnswer._reader.segment._4_4_,promisedAnswer._reader.segment._0_4_);
      (this->super_Refcounted).super_Disposer._vptr_Disposer =
           (_func_int **)promisedAnswer._reader.capTable;
      promisedAnswer._reader.capTable = (CapTableReader *)0x0;
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::dispose
                ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
                 &promisedAnswer);
      kj::_::NullableValue<kj::OwnFd>::~NullableValue(&local_58);
      break;
    case 2:
      uVar4 = false;
      if (0x3f < descriptor._reader.dataSize) {
        uVar4 = (undefined1)*(undefined4 *)((long)descriptor._reader.data + 4);
      }
      kj::Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)&local_60,&fd);
      import((RpcConnectionState *)&promisedAnswer,importId,(bool)uVar4,(Maybe<kj::OwnFd> *)0x1);
      (this->super_ErrorHandler)._vptr_ErrorHandler =
           (_func_int **)
           CONCAT44(promisedAnswer._reader.segment._4_4_,promisedAnswer._reader.segment._0_4_);
      (this->super_Refcounted).super_Disposer._vptr_Disposer =
           (_func_int **)promisedAnswer._reader.capTable;
      promisedAnswer._reader.capTable = (CapTableReader *)0x0;
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::dispose
                ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
                 &promisedAnswer);
      kj::_::NullableValue<kj::OwnFd>::~NullableValue(&local_60);
      break;
    case 3:
      anon_unknown_18::
      ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::find
                ((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)
                 &promisedAnswer,importId + 0x1b8);
      lVar1 = CONCAT44(promisedAnswer._reader.segment._4_4_,promisedAnswer._reader.segment._0_4_);
      if (lVar1 == 0) {
        reason_00.content.size_ = (size_t)"invalid \'receiverHosted\' export ID";
        reason_00.content.ptr = (char *)&promisedAnswer;
        newBrokenCap(reason_00);
        (this->super_ErrorHandler)._vptr_ErrorHandler =
             (_func_int **)
             CONCAT44(promisedAnswer._reader.segment._4_4_,promisedAnswer._reader.segment._0_4_);
        (this->super_Refcounted).super_Disposer._vptr_Disposer =
             (_func_int **)promisedAnswer._reader.capTable;
        promisedAnswer._reader.capTable = (CapTableReader *)0x0;
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)&promisedAnswer);
      }
      else {
        (**(code **)(**(long **)(lVar1 + 0x10) + 0x20))(&promisedAnswer);
        pCVar2 = promisedAnswer._reader.capTable;
        if ((*(int **)(lVar1 + 0x30) != (int *)0x0) && (**(int **)(lVar1 + 0x30) == 2)) {
          bVar6 = (RpcSystemBrand *)promisedAnswer._reader.capTable[1]._vptr_CapTableReader ==
                  (params_00->brand).ptr;
          result.disposer = (Disposer *)CONCAT71(result.disposer._1_7_,bVar6);
          if (!bVar6) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)&ops,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x855,FAILED,"isSameNetwork(*result)","_kjCondition,",
                       (DebugExpression<bool> *)&result);
            kj::_::Debug::Fault::fatal((Fault *)&ops);
          }
          ops.ptr = (PipelineOp *)
                    CONCAT44(promisedAnswer._reader.segment._4_4_,
                             promisedAnswer._reader.segment._0_4_);
          promisedAnswer._reader.capTable = (CapTableReader *)0x0;
          ops.size_ = (size_t)pCVar2;
          params = (RpcConnectionState *)pCVar2[5]._vptr_CapTableReader;
          clone<capnp::AnyPointer::Reader&,capnp::AnyPointer>((Reader *)local_f8);
          kj::
          refcounted<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
                    ((kj *)&local_78,params,
                     (Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)local_f8,
                     (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
                     &ops);
          result.disposer = local_78.disposer;
          result.ptr = (ClientHook *)local_78.ptr;
          local_78.ptr = (DeferredThirdPartyClient *)0x0;
          kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
                    ((Own<capnp::ClientHook,_std::nullptr_t> *)&promisedAnswer,&result);
          kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&result);
          kj::
          Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,_std::nullptr_t>
          ::dispose(&local_78);
          if ((TribbleRaceBlocker *)local_f8._8_8_ != (TribbleRaceBlocker *)0x0) {
            local_f8._8_8_ = (TribbleRaceBlocker *)0x0;
            (*(code *)(*(Arena **)local_f8._0_8_)->_vptr_Arena)();
          }
          kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::dispose
                    ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
                     &ops);
        }
        if (((RpcSystemBrand *)promisedAnswer._reader.capTable[1]._vptr_CapTableReader ==
             (params_00->brand).ptr) &&
           ((RpcConnectionState *)promisedAnswer._reader.capTable[5]._vptr_CapTableReader ==
            params_00)) {
          kj::
          refcounted<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                    ((kj *)&result,(Own<capnp::ClientHook,_std::nullptr_t> *)&promisedAnswer);
          ops.ptr = (PipelineOp *)result.disposer;
          ops.size_ = (size_t)result.ptr;
          result.ptr = (ClientHook *)0x0;
          kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
                    ((Own<capnp::ClientHook,_std::nullptr_t> *)&promisedAnswer,
                     (Own<capnp::ClientHook,_std::nullptr_t> *)&ops);
          kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                    ((Own<capnp::ClientHook,_std::nullptr_t> *)&ops);
          kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,_std::nullptr_t>::
          dispose((Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,_std::nullptr_t>
                   *)&result);
        }
        (this->super_ErrorHandler)._vptr_ErrorHandler =
             (_func_int **)
             CONCAT44(promisedAnswer._reader.segment._4_4_,promisedAnswer._reader.segment._0_4_);
        (this->super_Refcounted).super_Disposer._vptr_Disposer =
             (_func_int **)promisedAnswer._reader.capTable;
        promisedAnswer._reader.capTable = (CapTableReader *)0x0;
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)&promisedAnswer);
      }
      break;
    case 4:
      rpc::CapDescriptor::Reader::getReceiverAnswer(&promisedAnswer,&descriptor);
      anon_unknown_18::
      ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::find
                ((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *)
                 &ops,importId + 0x2d8);
      pPVar3 = ops.ptr;
      if ((ops.ptr == (PipelineOp *)0x0) || (ops.ptr[1] == (PipelineOp)0x0)) {
        reason.content.size_ = (size_t)"invalid \'receiverAnswer\'";
        reason.content.ptr = (char *)&ops;
        newBrokenCap(reason);
        (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)ops.ptr;
        (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)ops.size_;
        ops.size_ = 0;
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)&ops);
      }
      else {
        rpc::PromisedAnswer::Reader::getTransform((Reader *)local_50,&promisedAnswer);
        ops_00.reader.capTable = (CapTableReader *)local_50._8_8_;
        ops_00.reader.segment = (SegmentReader *)local_50._0_8_;
        ops_00.reader.ptr = (byte *)local_50._16_8_;
        ops_00.reader.elementCount = local_50._24_4_;
        ops_00.reader.step = local_50._28_4_;
        ops_00.reader.structDataSize = local_50._32_4_;
        ops_00.reader.structPointerCount = local_50._36_2_;
        ops_00.reader.elementSize = local_50[0x26];
        ops_00.reader._39_1_ = local_50[0x27];
        ops_00.reader._40_8_ = local_50._40_8_;
        anon_unknown_18::toPipelineOps(ops_00);
        (**(code **)(*(long *)pPVar3[1] + 8))(&result,pPVar3[1],ops.ptr,ops.size_);
        if (((RpcSystemBrand *)(result.ptr)->brand == (params_00->brand).ptr) &&
           ((RpcConnectionState *)result.ptr[2].brand == params_00)) {
          kj::
          refcounted<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                    ((kj *)local_f8,&result);
          local_78.disposer = (Disposer *)local_f8._0_8_;
          local_78.ptr = (DeferredThirdPartyClient *)local_f8._8_8_;
          local_f8._8_8_ = (TribbleRaceBlocker *)0x0;
          kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
                    (&result,(Own<capnp::ClientHook,_std::nullptr_t> *)&local_78);
          kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                    ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_78);
          kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,_std::nullptr_t>::
          dispose((Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,_std::nullptr_t>
                   *)local_f8);
        }
        (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)result.disposer;
        (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)result.ptr;
        result.ptr = (ClientHook *)0x0;
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&result);
        kj::Array<capnp::PipelineOp>::~Array(&ops);
      }
      break;
    case 5:
      rpc::CapDescriptor::Reader::getThirdPartyHosted((Reader *)&promisedAnswer,&descriptor);
      uVar4 = false;
      if (0x1f < promisedAnswer._reader.dataSize) {
        uVar4 = (undefined1)*promisedAnswer._reader.data;
      }
      kj::Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)&local_68,&fd);
      import((RpcConnectionState *)&result,importId,(bool)uVar4,(Maybe<kj::OwnFd> *)0x0);
      kj::_::NullableValue<kj::OwnFd>::~NullableValue(&local_68);
      ops.disposer = (ArrayDisposer *)0x0;
      if (promisedAnswer._reader.pointerCount != 0) {
        ops.disposer = (ArrayDisposer *)promisedAnswer._reader.pointers;
      }
      uVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
      uVar10 = 0;
      if (promisedAnswer._reader.pointerCount != 0) {
        uVar7 = promisedAnswer._reader.segment._0_4_;
        uVar8 = promisedAnswer._reader.segment._4_4_;
        uVar9 = promisedAnswer._reader.capTable._0_4_;
        uVar10 = promisedAnswer._reader.capTable._4_4_;
      }
      ops.ptr = (PipelineOp *)CONCAT44(uVar8,uVar7);
      ops.size_ = CONCAT44(uVar10,uVar9);
      clone<capnp::AnyPointer::Reader,capnp::AnyPointer>((Reader *)local_f8);
      kj::
      refcounted<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
                ((kj *)&local_78,params_00,
                 (Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)local_f8,
                 (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
                 &result);
      (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_78.disposer;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_78.ptr;
      local_78.ptr = (DeferredThirdPartyClient *)0x0;
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,_std::nullptr_t>
      ::dispose(&local_78);
      if ((TribbleRaceBlocker *)local_f8._8_8_ != (TribbleRaceBlocker *)0x0) {
        local_f8._8_8_ = (TribbleRaceBlocker *)0x0;
        (*(code *)(*(Arena **)local_f8._0_8_)->_vptr_Arena)();
      }
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::dispose
                ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
                 &result);
      break;
    default:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
                ((Fault *)&promisedAnswer,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x882,FAILED,(char *)0x0,"\"unknown CapDescriptor type\"",
                 (char (*) [27])"unknown CapDescriptor type");
      kj::_::Debug::Fault::fatal((Fault *)&promisedAnswer);
    }
  }
  kj::_::NullableValue<kj::OwnFd>::~NullableValue(&fd.ptr);
  MVar11.ptr.ptr = extraout_RDX;
  MVar11.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar11.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> receiveCap(rpc::CapDescriptor::Reader descriptor,
                                            kj::ArrayPtr<kj::OwnFd> fds) {
    uint fdIndex = descriptor.getAttachedFd();
    kj::Maybe<kj::OwnFd> fd;
    if (fdIndex < fds.size() && fds[fdIndex] != nullptr) {
      fd = kj::mv(fds[fdIndex]);
    }

    switch (descriptor.which()) {
      case rpc::CapDescriptor::NONE:
        return kj::none;

      case rpc::CapDescriptor::SENDER_HOSTED:
        return import(descriptor.getSenderHosted(), false, kj::mv(fd));
      case rpc::CapDescriptor::SENDER_PROMISE:
        return import(descriptor.getSenderPromise(), true, kj::mv(fd));

      case rpc::CapDescriptor::RECEIVER_HOSTED:
        KJ_IF_SOME(exp, exports.find(descriptor.getReceiverHosted())) {
          auto result = exp.clientHook->addRef();
          KJ_IF_SOME(vineInfo, exp.vineInfo) {
            KJ_IF_SOME(contact, vineInfo->info.tryGet<VineInfo::Contact>()) {
              // This is a vine, and not the root of the vine. We previously forwarded a
              // three-party handoff to the peer, and the peer reflected it back to us. We need
              // to wrap this in a new `DeferredThirdPartyClient` so that if it is sent to yet
              // another party, it will be handed off correctly. If we just pass along the vine
              // itself, then three-party handoff will stop working.
              KJ_ASSERT(isSameNetwork(*result));
              kj::Own<RpcClient> vine = result.downcast<RpcClient>();
              auto& vineConnection = *vine->connectionState;
              result = kj::refcounted<DeferredThirdPartyClient>(
                  vineConnection, capnp::clone(*contact), kj::mv(vine));
            }
          }
          if (unwrapIfSameConnection(*result) != kj::none) {
            result = kj::refcounted<TribbleRaceBlocker>(kj::mv(result));
          }
          return kj::mv(result);
        } else {
          return newBrokenCap("invalid 'receiverHosted' export ID");
        }

      case rpc::CapDescriptor::RECEIVER_ANSWER: {
        auto promisedAnswer = descriptor.getReceiverAnswer();

        KJ_IF_SOME(answer, answers.find(promisedAnswer.getQuestionId())) {
          KJ_IF_SOME(pipeline, answer.pipeline) {
            auto ops = toPipelineOps(promisedAnswer.getTransform());
            auto result = pipeline->getPipelinedCap(ops);
            if (unwrapIfSameConnection(*result) != kj::none) {
              result = kj::refcounted<TribbleRaceBlocker>(kj::mv(result));
            }
            return kj::mv(result);
          }
        }

        return newBrokenCap("invalid 'receiverAnswer'");
      }

      case rpc::CapDescriptor::THIRD_PARTY_HOSTED: {
        // We need to connect to a third party to accept this capability.

        auto tph = descriptor.getThirdPartyHosted();

        // Import the vine first so that we're sure to drop it if anything goes wrong.
        auto vine = import(tph.getVineId(), false, kj::mv(fd));

        return kj::refcounted<DeferredThirdPartyClient>(
            *this, capnp::clone(tph.getId()), kj::mv(vine));
      }

      default:
        KJ_FAIL_REQUIRE("unknown CapDescriptor type");
        return newBrokenCap("unknown CapDescriptor type");
    }